

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgLongPoll.cpp
# Opt level: O3

void __thiscall TgBot::TgLongPoll::start(TgLongPoll *this)

{
  EventHandler *this_00;
  pointer psVar1;
  vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> updates;
  Ptr local_50;
  vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_> local_40;
  
  Api::getUpdates(&local_40,this->_api,this->_lastUpdateId,this->_limit,this->_timeout,
                  &this->_allowupdates);
  if (local_40.
      super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_40.
      super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = local_40.
             super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar1->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this->_lastUpdateId <=
          (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->updateId)
      {
        this->_lastUpdateId =
             (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             updateId + 1;
      }
      this_00 = this->_eventHandler;
      local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar1->super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      EventHandler::handleUpdate(this_00,&local_50);
      if (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar1 = psVar1 + 1;
    } while (psVar1 != local_40.
                       super__Vector_base<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<std::shared_ptr<TgBot::Update>,_std::allocator<std::shared_ptr<TgBot::Update>_>_>::
  ~vector(&local_40);
  return;
}

Assistant:

void TgLongPoll::start() {
    std::vector<Update::Ptr> updates = _api->getUpdates(_lastUpdateId, _limit, _timeout, _allowupdates);
    for (Update::Ptr& item : updates) {
        if (item->updateId >= _lastUpdateId) {
            _lastUpdateId = item->updateId + 1;
        }
        _eventHandler->handleUpdate(item);
    }
}